

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O1

int __thiscall Fl_File_Icon::load_image(Fl_File_Icon *this,char *ifile)

{
  char **ppcVar1;
  Fl_File_Icon *pFVar2;
  byte bVar3;
  int iVar4;
  Fl_Shared_Image *this_00;
  void *__s;
  char *pcVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  uint uVar9;
  Fl_Color c;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  Fl_Color FVar15;
  Fl_Color c_00;
  int iVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  byte *pbVar20;
  char **ppcVar21;
  char val [16];
  int ncolors;
  int chars_per_color;
  char local_78;
  char local_77;
  undefined1 local_76;
  long local_60;
  int local_58;
  int local_54;
  ulong local_50;
  int local_44;
  long local_40;
  Fl_File_Icon *local_38;
  
  local_38 = this;
  this_00 = Fl_Shared_Image::get(ifile,0,0);
  iVar6 = -1;
  if ((((this_00 != (Fl_Shared_Image *)0x0) &&
       (iVar4 = (this_00->super_Fl_Image).count_, iVar4 != 0)) &&
      (iVar7 = (this_00->super_Fl_Image).w_, iVar7 != 0)) && ((this_00->super_Fl_Image).h_ != 0)) {
    if (iVar4 == 1) {
      iVar6 = (this_00->super_Fl_Image).ld_;
      if (iVar6 == 0) {
        local_40 = 0;
      }
      else {
        local_40 = (long)(iVar6 - iVar7 * (this_00->super_Fl_Image).d_);
      }
      if (0 < (this_00->super_Fl_Image).h_) {
        pbVar20 = (byte *)*(this_00->super_Fl_Image).data_;
        iVar6 = 0;
        do {
          local_50 = CONCAT44(local_50._4_4_,iVar6);
          if ((this_00->super_Fl_Image).w_ < 1) {
            c_00 = 0xffffffff;
            iVar7 = 0;
            iVar4 = 0;
          }
          else {
            iVar6 = iVar6 * 9000;
            iVar12 = 0;
            iVar7 = 0;
            c = 0xffffffff;
            iVar16 = 0;
            do {
              pFVar2 = local_38;
              iVar4 = (this_00->super_Fl_Image).d_;
              if (iVar4 == 3) {
LAB_0020bdc7:
                uVar19 = (uint)pbVar20[1];
                bVar8 = pbVar20[2];
                if ((pbVar20[1] == 0 && *pbVar20 == 0) && bVar8 == 0) {
LAB_0020be10:
                  FVar15 = 0x38;
                }
                else {
                  uVar9 = (uint)*pbVar20;
LAB_0020be00:
                  FVar15 = (uVar19 << 8 | uVar9 << 0x10 | (uint)bVar8) << 8;
                }
              }
              else if (iVar4 == 2) {
                FVar15 = 0xffffffff;
                if ((char)pbVar20[1] < '\0') goto LAB_0020bdf0;
              }
              else {
                if (iVar4 == 1) {
LAB_0020bdf0:
                  bVar8 = *pbVar20;
                  if (bVar8 == 0) goto LAB_0020be10;
                  uVar19 = (uint)bVar8;
                  uVar9 = uVar19;
                  goto LAB_0020be00;
                }
                FVar15 = 0xffffffff;
                if ((char)pbVar20[3] < '\0') goto LAB_0020bdc7;
              }
              c_00 = c;
              iVar4 = iVar16;
              if (((FVar15 != c) && (c_00 = FVar15, iVar4 = iVar7, iVar16 < iVar7)) &&
                 (c != 0xffffffff)) {
                add_color(local_38,c);
                add(pFVar2,4);
                local_60 = CONCAT44(local_60._4_4_,iVar16 * 9000);
                add_vertex(pFVar2,(iVar16 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - iVar6 / (this_00->super_Fl_Image).h_);
                add_vertex(pFVar2,iVar12 / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - iVar6 / (this_00->super_Fl_Image).h_);
                add_vertex(pFVar2,iVar12 / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - (iVar6 + 9000) / (this_00->super_Fl_Image).h_);
                add_vertex(pFVar2,(int)local_60 / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - (iVar6 + 9000) / (this_00->super_Fl_Image).h_);
                add(pFVar2,0);
              }
              iVar7 = iVar7 + 1;
              pbVar20 = pbVar20 + (this_00->super_Fl_Image).d_;
              iVar12 = iVar12 + 9000;
              c = c_00;
              iVar16 = iVar4;
            } while (iVar7 < (this_00->super_Fl_Image).w_);
          }
          pFVar2 = local_38;
          if ((iVar4 < iVar7) && (c_00 != 0xffffffff)) {
            add_color(local_38,c_00);
            add(pFVar2,4);
            local_60 = CONCAT44(local_60._4_4_,iVar4 * 9000);
            iVar6 = (int)local_50 * 9000;
            add_vertex(pFVar2,(iVar4 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar6 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar2,(iVar7 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar6 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar2,(iVar7 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (iVar6 + 9000) / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar2,(int)local_60 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (iVar6 + 9000) / (this_00->super_Fl_Image).h_);
            add(pFVar2,0);
          }
          iVar6 = (int)local_50 + 1;
          pbVar20 = pbVar20 + local_40;
        } while (iVar6 < (this_00->super_Fl_Image).h_);
      }
    }
    else {
      ppcVar1 = (this_00->super_Fl_Image).data_;
      __isoc99_sscanf(*ppcVar1,"%*d%*d%d%d",&local_54,&local_44);
      bVar8 = (char)local_44 << 3;
      __s = operator_new__((ulong)(uint)(4 << (bVar8 & 0x1f)));
      memset(__s,0,4L << (bVar8 & 0x3f));
      ppcVar21 = ppcVar1 + 1;
      if (local_54 < 0) {
        local_54 = -local_54;
        pcVar5 = *ppcVar21;
        iVar6 = 1;
        if (1 < local_54) {
          iVar6 = local_54;
        }
        lVar17 = 0;
        do {
          if ((pcVar5[lVar17 * 4 + 2] == 0 && pcVar5[lVar17 * 4 + 1] == 0) &&
              pcVar5[lVar17 * 4 + 3] == 0) {
            iVar4 = 0x38;
          }
          else {
            iVar4 = ((uint)(byte)pcVar5[lVar17 * 4 + 2] << 8 |
                     (uint)(byte)pcVar5[lVar17 * 4 + 1] << 0x10 | (uint)(byte)pcVar5[lVar17 * 4 + 3]
                    ) << 8;
          }
          *(int *)((long)__s + (ulong)(byte)pcVar5[lVar17 * 4] * 4) = iVar4;
          lVar17 = lVar17 + 1;
        } while (iVar6 != (int)lVar17);
        ppcVar21 = ppcVar1 + 2;
        uVar9 = 0x20;
      }
      else if (local_54 < 1) {
        uVar9 = 0x20;
      }
      else {
        uVar9 = 0x20;
        iVar6 = 0;
        do {
          pcVar5 = *ppcVar21;
          uVar19 = (uint)*pcVar5;
          if (local_44 < 2) {
            pcVar10 = pcVar5 + 1;
          }
          else {
            pcVar10 = pcVar5 + 2;
            uVar19 = uVar19 << 8 | (int)pcVar5[1];
          }
          pcVar5 = strstr(pcVar10,"c ");
          lVar17 = (long)(int)uVar19;
          if (pcVar5 == (char *)0x0) {
LAB_0020bc25:
            *(undefined4 *)((long)__s + lVar17 * 4) = 0x38;
          }
          else if (pcVar5[2] == '#') {
            uVar18 = 0;
            local_60 = lVar17;
            do {
              iVar4 = isxdigit((int)pcVar5[uVar18 + 3]);
              if (iVar4 == 0) goto LAB_0020bafc;
              uVar18 = uVar18 + 1;
            } while (uVar18 != 0xc);
            uVar18 = 0xc;
LAB_0020bafc:
            bVar8 = 0;
            uVar13 = uVar9;
            switch((int)uVar18) {
            case 3:
              local_78 = pcVar5[3];
              local_77 = 0;
              lVar17 = strtol(&local_78,(char **)0x0,0x10);
              bVar8 = (char)lVar17 * '\x11';
              local_78 = pcVar5[4];
              local_77 = 0;
              lVar17 = strtol(&local_78,(char **)0x0,0x10);
              uVar11 = (int)lVar17 * 0x11;
              local_78 = pcVar5[5];
              local_77 = '\0';
              lVar17 = strtol(&local_78,(char **)0x0,0x10);
              bVar3 = (char)lVar17 * '\x11';
              break;
            case 4:
            case 5:
            case 7:
            case 8:
            case 10:
            case 0xb:
switchD_0020bb1d_caseD_4:
              uVar9 = uVar13;
              bVar8 = 0;
              uVar11 = 0;
              bVar3 = 0;
              break;
            case 6:
            case 9:
            case 0xc:
              uVar14 = (uVar18 & 0xffffffff) / 3;
              local_78 = pcVar5[3];
              local_77 = pcVar5[4];
              local_76 = 0;
              local_50 = strtol(&local_78,(char **)0x0,0x10);
              local_78 = pcVar5[uVar14 + 3];
              local_77 = pcVar5[uVar14 + 4];
              local_76 = 0;
              lVar17 = strtol(&local_78,(char **)0x0,0x10);
              uVar11 = (uint)lVar17;
              uVar18 = (ulong)((uint)((uVar18 & 0xffffffff) * 0xaaaaaaab >> 0x20) & 0xfffffffe);
              local_78 = pcVar5[uVar18 + 3];
              local_77 = pcVar5[uVar18 + 4];
              local_76 = 0;
              lVar17 = strtol(&local_78,(char **)0x0,0x10);
              bVar3 = (byte)lVar17;
              bVar8 = (byte)local_50;
              break;
            default:
              uVar11 = 0;
              bVar3 = 0;
              uVar13 = uVar19;
              if ((int)uVar18 == 0) goto switchD_0020bb1d_caseD_4;
            }
            if (((char)uVar11 == '\0' && bVar8 == 0) && bVar3 == 0) {
              iVar4 = 0x38;
            }
            else {
              iVar4 = ((uint)bVar3 | (uVar11 & 0xff) << 8 | (uint)bVar8 << 0x10) << 8;
            }
            *(int *)((long)__s + local_60 * 4) = iVar4;
          }
          else {
            pcVar5 = pcVar5 + 2;
            iVar4 = strncasecmp(pcVar5,"white",5);
            if (iVar4 == 0) {
              *(undefined4 *)((long)__s + lVar17 * 4) = 0xff;
            }
            else {
              iVar4 = strncasecmp(pcVar5,"black",5);
              if (iVar4 == 0) goto LAB_0020bc25;
              iVar4 = strncasecmp(pcVar5,"none",4);
              if (iVar4 == 0) {
                *(undefined4 *)((long)__s + lVar17 * 4) = 0x38;
                uVar9 = uVar19;
              }
              else {
                *(undefined4 *)((long)__s + lVar17 * 4) = 0x31;
              }
            }
          }
          iVar6 = iVar6 + 1;
          ppcVar21 = ppcVar21 + 1;
        } while (iVar6 < local_54);
      }
      if (0 < (this_00->super_Fl_Image).h_) {
        iVar6 = 0;
        do {
          iVar4 = 0;
          iVar7 = 0;
          uVar19 = uVar9;
          local_58 = iVar6;
          if (0 < (this_00->super_Fl_Image).w_) {
            pcVar5 = *ppcVar21;
            local_50 = (ulong)(uint)(iVar6 * 9000);
            local_40 = CONCAT44(local_40._4_4_,iVar6 * 9000 + 9000);
            iVar4 = 0;
            iVar7 = 0;
            iVar6 = 0;
            do {
              pFVar2 = local_38;
              uVar13 = (uint)*pcVar5;
              if (local_44 < 2) {
                pcVar5 = pcVar5 + 1;
              }
              else {
                pcVar10 = pcVar5 + 1;
                pcVar5 = pcVar5 + 2;
                uVar13 = uVar13 << 8 | (int)*pcVar10;
              }
              iVar16 = iVar7;
              uVar11 = uVar19;
              if ((uVar13 != uVar19) && (iVar16 = iVar6, uVar11 = uVar13, uVar19 != uVar9)) {
                add_color(local_38,*(Fl_Color *)((long)__s + (long)(int)uVar19 * 4));
                add(pFVar2,4);
                uVar18 = local_50;
                local_60 = CONCAT44(local_60._4_4_,iVar7 * 9000);
                uVar19 = (int)local_50 >> 0x1f;
                add_vertex(pFVar2,(iVar7 * 9000) / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - (int)((long)((ulong)uVar19 << 0x20 | local_50 & 0xffffffff) /
                                         (long)(this_00->super_Fl_Image).h_));
                add_vertex(pFVar2,iVar4 / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - (int)((long)((ulong)uVar19 << 0x20 | uVar18 & 0xffffffff) /
                                         (long)(this_00->super_Fl_Image).h_));
                iVar7 = (int)local_40;
                add_vertex(pFVar2,iVar4 / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - (int)local_40 / (this_00->super_Fl_Image).h_);
                add_vertex(pFVar2,(int)local_60 / (this_00->super_Fl_Image).w_ + 1000,
                           0x251c - iVar7 / (this_00->super_Fl_Image).h_);
                add(pFVar2,0);
              }
              uVar19 = uVar11;
              iVar7 = iVar16;
              iVar6 = iVar6 + 1;
              iVar4 = iVar4 + 9000;
            } while (iVar6 < (this_00->super_Fl_Image).w_);
            iVar7 = iVar7 * 9000;
          }
          pFVar2 = local_38;
          iVar6 = local_58;
          if (uVar19 != uVar9) {
            add_color(local_38,*(Fl_Color *)((long)__s + (long)(int)uVar19 * 4));
            add(pFVar2,4);
            iVar16 = local_58 * 9000;
            add_vertex(pFVar2,iVar7 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar16 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar2,iVar4 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - iVar16 / (this_00->super_Fl_Image).h_);
            add_vertex(pFVar2,iVar4 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (iVar16 + 9000) / (this_00->super_Fl_Image).h_);
            iVar6 = local_58;
            add_vertex(pFVar2,iVar7 / (this_00->super_Fl_Image).w_ + 1000,
                       0x251c - (iVar16 + 9000) / (this_00->super_Fl_Image).h_);
            add(pFVar2,0);
          }
          iVar6 = iVar6 + 1;
          ppcVar21 = ppcVar21 + 1;
        } while (iVar6 < (this_00->super_Fl_Image).h_);
      }
      operator_delete__(__s);
    }
    Fl_Shared_Image::release(this_00);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Fl_File_Icon::load_image(const char *ifile)	// I - File to read from
{
  Fl_Shared_Image	*img;		// Image file


  img = Fl_Shared_Image::get(ifile);
  if (!img || !img->count() || !img->w() || !img->h()) return -1;

  if (img->count() == 1) {
    int		x, y;		// X & Y in image
    int		startx;		// Starting X coord
    Fl_Color	c,		// Current color
		temp;		// Temporary color
    const uchar *row;		// Pointer into image

    const int extra_data = img->ld() ? (img->ld()-img->w()*img->d()) : 0;

    // Loop through grayscale or RGB image...
    for (y = 0, row = (const uchar *)(*(img->data())); y < img->h(); y ++, row += extra_data)
    {
      for (x = 0, startx = 0, c = (Fl_Color)-1;
           x < img->w();
	   x ++, row += img->d())
      {
	switch (img->d())
	{
          case 1 :
              temp = fl_rgb_color(row[0], row[0], row[0]);
	      break;
          case 2 :
	      if (row[1] > 127)
        	temp = fl_rgb_color(row[0], row[0], row[0]);
	      else
		temp = (Fl_Color)-1;
	      break;
	  case 3 :
              temp = fl_rgb_color(row[0], row[1], row[2]);
	      break;
	  default :
	      if (row[3] > 127)
        	temp = fl_rgb_color(row[0], row[1], row[2]);
	      else
		temp = (Fl_Color)-1;
	      break;
	}

	if (temp != c)
	{
	  if (x > startx && c != (Fl_Color)-1)
	  {
	    add_color(c);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
	  }

          c      = temp;
	  startx = x;
	}
      }

      if (x > startx && c != (Fl_Color)-1)
      {
	add_color(c);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }
  } else {
    int		i, j;			// Looping vars
    int		ch;			// Current character
    int		newch;			// New character
    int		bg;			// Background color
    char	val[16];		// Color value
    const char	*lineptr,		// Pointer into line
		*const*ptr;		// Pointer into data array
    int		ncolors,		// Number of colors
		chars_per_color;	// Characters per color
    Fl_Color	*colors;		// Colors
    int		red, green, blue;	// Red, green, and blue values
    int		x, y;			// X & Y in image
    int		startx;			// Starting X coord

    // Get the pixmap data...
    ptr = img->data();
    sscanf(*ptr, "%*d%*d%d%d", &ncolors, &chars_per_color);

    colors = new Fl_Color[1 << (chars_per_color * 8)];

    // Read the colormap...
    memset(colors, 0, sizeof(Fl_Color) << (chars_per_color * 8));
    bg = ' ';

    ptr ++;

    if (ncolors < 0) {
      // Read compressed colormap...
      const uchar *cmapptr;

      ncolors = -ncolors;

      for (i = 0, cmapptr = (const uchar *)*ptr; i < ncolors; i ++, cmapptr += 4)
        colors[cmapptr[0]] = fl_rgb_color(cmapptr[1], cmapptr[2], cmapptr[3]);

      ptr ++;
    } else {
      for (i = 0; i < ncolors; i ++, ptr ++) {
	// Get the color's character
	lineptr = *ptr;
	ch      = *lineptr++;

        if (chars_per_color > 1) ch = (ch << 8) | *lineptr++;

	// Get the color value...
	if ((lineptr = strstr(lineptr, "c ")) == NULL) {
	  // No color; make this black...
	  colors[ch] = FL_BLACK;
	} else if (lineptr[2] == '#') {
	  // Read the RGB triplet...
	  lineptr += 3;
	  for (j = 0; j < 12; j ++)
            if (!isxdigit(lineptr[j]))
	      break;

	  switch (j) {
            case 0 :
		bg = ch;
	    default :
		red = green = blue = 0;
		break;

            case 3 :
		val[0] = lineptr[0];
		val[1] = '\0';
		red = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[1];
		val[1] = '\0';
		green = 255 * strtol(val, NULL, 16) / 15;

		val[0] = lineptr[2];
		val[1] = '\0';
		blue = 255 * strtol(val, NULL, 16) / 15;
		break;

            case 6 :
            case 9 :
            case 12 :
		j /= 3;

		val[0] = lineptr[0];
		val[1] = lineptr[1];
		val[2] = '\0';
		red = strtol(val, NULL, 16);

		val[0] = lineptr[j + 0];
		val[1] = lineptr[j + 1];
		val[2] = '\0';
		green = strtol(val, NULL, 16);

		val[0] = lineptr[2 * j + 0];
		val[1] = lineptr[2 * j + 1];
		val[2] = '\0';
		blue = strtol(val, NULL, 16);
		break;
	  }

	  colors[ch] = fl_rgb_color((uchar)red, (uchar)green, (uchar)blue);
	} else {
	  // Read a color name...
	  if (strncasecmp(lineptr + 2, "white", 5) == 0) colors[ch] = FL_WHITE;
	  else if (strncasecmp(lineptr + 2, "black", 5) == 0) colors[ch] = FL_BLACK;
	  else if (strncasecmp(lineptr + 2, "none", 4) == 0) {
            colors[ch] = FL_BLACK;
	    bg = ch;
	  } else colors[ch] = FL_GRAY;
	}
      }
    }

    // Read the image data...
    for (y = 0; y < img->h(); y ++, ptr ++) {
      lineptr = *ptr;
      startx  = 0;
      ch      = bg;

      for (x = 0; x < img->w(); x ++) {
	newch = *lineptr++;

        if (chars_per_color > 1) newch = (newch << 8) | *lineptr++;

	if (newch != ch) {
	  if (ch != bg) {
            add_color(colors[ch]);
	    add(POLYGON);
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	    add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	    add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	    add(END);
          }

	  ch     = newch;
	  startx = x;
	}
      }

      if (ch != bg) {
	add_color(colors[ch]);
	add(POLYGON);
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - y * 9000 / img->h());
	add_vertex(x * 9000 / img->w() + 1000,      9500 - (y + 1) * 9000 / img->h());
	add_vertex(startx * 9000 / img->w() + 1000, 9500 - (y + 1) * 9000 / img->h());
	add(END);
      }
    }

    // Free the colormap...
    delete[] colors;
  }

  img->release();

#ifdef DEBUG
{
  int i;
  printf("Icon File \"%s\":\n", ifile);
  for (i = 0; i < num_data_; i ++)
  {
    printf("    %d,\n", data_[i]);
  }
}
#endif // DEBUG

  return 0;
}